

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O1

void __thiscall
diy::detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
          (ReductionFunctor<void,_diy::RegularSwapPartners> *this,int round_,Callback *reduce_,
          RegularSwapPartners *partners_,Assigner *assigner_)

{
  this->round = round_;
  Catch::clara::std::
  function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>::function
            (&this->reduce,reduce_);
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&this->partners,
             (vector<int,_std::allocator<int>_> *)partners_);
  Catch::clara::std::vector<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
  ::vector(&(this->partners).super_RegularPartners.kvs_,&(partners_->super_RegularPartners).kvs_);
  (this->partners).super_RegularPartners.contiguous_ =
       (partners_->super_RegularPartners).contiguous_;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            (&(this->partners).super_RegularPartners.steps_,
             &(partners_->super_RegularPartners).steps_);
  this->assigner = assigner_;
  return;
}

Assistant:

ReductionFunctor(int round_, const Callback& reduce_, const Partners& partners_, const Assigner& assigner_):
                    round(round_), reduce(reduce_), partners(partners_), assigner(assigner_)        {}